

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id,bool allow_alias)

{
  SPIRFunction *pSVar1;
  Meta *pMVar2;
  
  pSVar1 = (this->super_CompilerGLSL).super_Compiler.current_function;
  if ((((pSVar1 != (SPIRFunction *)0x0) &&
       ((pSVar1->super_IVariant).self.id ==
        (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id)) &&
      (pMVar2 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,(ID)id),
      pMVar2 != (Meta *)0x0)) &&
     (((pMVar2->decoration).qualified_alias_explicit_override == false &&
      ((pMVar2->decoration).qualified_alias._M_string_length != 0)))) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(pMVar2->decoration).qualified_alias);
    return __return_storage_ptr__;
  }
  Compiler::to_name_abi_cxx11_(__return_storage_ptr__,(Compiler *)this,id,allow_alias);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_name(uint32_t id, bool allow_alias) const
{
	if (current_function && (current_function->self == ir.default_entry_point))
	{
		auto *m = ir.find_meta(id);
		if (m && !m->decoration.qualified_alias_explicit_override && !m->decoration.qualified_alias.empty())
			return m->decoration.qualified_alias;
	}
	return Compiler::to_name(id, allow_alias);
}